

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

void __thiscall
Js::ConcatString::ConcatString(ConcatString *this,JavascriptString *a,JavascriptString *b)

{
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  JavascriptLibrary *this_00;
  StaticType *stringTypeStatic;
  undefined4 *puVar5;
  JavascriptString *ptr;
  JavascriptString *ptr_00;
  JavascriptString *b_local;
  JavascriptString *a_local;
  ConcatString *this_local;
  
  this_00 = RecyclableObject::GetLibrary(&a->super_RecyclableObject);
  stringTypeStatic = JavascriptLibrary::GetStringTypeStatic(this_00);
  ConcatStringN<2>::ConcatStringN(&this->super_ConcatStringN<2>,stringTypeStatic,false);
  (this->super_ConcatStringN<2>).super_ConcatStringBase.super_LiteralString.super_JavascriptString.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)&PTR_Finalize_01dfdb70;
  if (a == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x12d,"(a)","a");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (b == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ConcatString.cpp"
                                ,0x12e,"(b)","b");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ptr = CompoundString::GetImmutableOrScriptUnreferencedString(a);
  ptr_00 = CompoundString::GetImmutableOrScriptUnreferencedString(b);
  Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
            ((this->super_ConcatStringN<2>).m_slots,ptr);
  Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
            ((this->super_ConcatStringN<2>).m_slots + 1,ptr_00);
  cVar3 = JavascriptString::GetLength(ptr);
  cVar4 = JavascriptString::GetLength(ptr_00);
  JavascriptString::SetLength((JavascriptString *)this,cVar3 + cVar4);
  return;
}

Assistant:

ConcatString::ConcatString(JavascriptString* a, JavascriptString* b) :
        ConcatStringN<2>(a->GetLibrary()->GetStringTypeStatic(), false)
    {
        Assert(a);
        Assert(b);

        a = CompoundString::GetImmutableOrScriptUnreferencedString(a);
        b = CompoundString::GetImmutableOrScriptUnreferencedString(b);

        m_slots[0] = a;
        m_slots[1] = b;

        this->SetLength(a->GetLength() + b->GetLength()); // does not include null character
    }